

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O2

int read_attribute_sub(coda_cdf_product *product_file,int64_t offset,int32_t byte_size,
                      coda_type *definition,coda_dynamic_type **attribute)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [11];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  uint8_t value;
  uint16_t value_00;
  int iVar29;
  double in_RAX;
  char *str;
  coda_mem_data *pcVar30;
  uchar *v;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double local_38;
  
  if (definition->type_class == coda_text_class) {
    str = (char *)malloc((ulong)(byte_size + 1));
    if (str == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                     (ulong)(uint)byte_size + 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                     ,0x4c);
      return -1;
    }
    iVar29 = read_bytes(product_file->raw_product,offset,(ulong)(uint)byte_size,str);
    if (iVar29 == 0) {
      str[(uint)byte_size] = '\0';
      pcVar30 = coda_mem_string_new((coda_type_text *)definition,(coda_dynamic_type *)0x0,
                                    (coda_product *)product_file,str);
      *attribute = (coda_dynamic_type *)pcVar30;
      free(str);
LAB_00143417:
      return -(uint)(pcVar30 == (coda_mem_data *)0x0);
    }
    free(str);
  }
  else {
    local_38 = in_RAX;
    iVar29 = read_bytes(product_file->raw_product,offset,(ulong)(uint)byte_size,&local_38);
    if (iVar29 == 0) {
      if (product_file->endianness == coda_big_endian) {
        auVar32[0] = SUB81(local_38,0);
        uVar33 = (undefined1)((ulong)local_38 >> 8);
        uVar34 = (undefined1)((ulong)local_38 >> 0x10);
        uVar35 = (undefined1)((ulong)local_38 >> 0x18);
        uVar36 = (undefined1)((ulong)local_38 >> 0x20);
        uVar37 = (undefined1)((ulong)local_38 >> 0x28);
        uVar38 = (undefined1)((ulong)local_38 >> 0x30);
        uVar39 = (undefined1)((ulong)local_38 >> 0x38);
        switch(byte_size) {
        case 1:
          break;
        case 2:
          local_38 = (double)CONCAT62(local_38._2_6_,local_38._0_2_ << 8 | local_38._0_2_ >> 8);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                        ,0x81,
                        "int read_attribute_sub(coda_cdf_product *, int64_t, int32_t, coda_type *, coda_dynamic_type **)"
                       );
        case 4:
          auVar9._8_6_ = 0;
          auVar9._0_8_ = local_38;
          auVar9[0xe] = uVar39;
          auVar11._8_4_ = 0;
          auVar11._0_8_ = local_38;
          auVar11[0xc] = uVar38;
          auVar11._13_2_ = auVar9._13_2_;
          auVar13._8_4_ = 0;
          auVar13._0_8_ = local_38;
          auVar13._12_3_ = auVar11._12_3_;
          auVar15._8_2_ = 0;
          auVar15._0_8_ = local_38;
          auVar15[10] = uVar37;
          auVar15._11_4_ = auVar13._11_4_;
          auVar17._8_2_ = 0;
          auVar17._0_8_ = local_38;
          auVar17._10_5_ = auVar15._10_5_;
          auVar19[8] = uVar36;
          auVar19._0_8_ = local_38;
          auVar19._9_6_ = auVar17._9_6_;
          auVar22._7_8_ = 0;
          auVar22._0_7_ = auVar19._8_7_;
          auVar25._1_8_ = SUB158(auVar22 << 0x40,7);
          auVar25[0] = uVar35;
          auVar25._9_6_ = 0;
          auVar26._1_10_ = SUB1510(auVar25 << 0x30,5);
          auVar26[0] = uVar34;
          auVar26._11_4_ = 0;
          auVar32._3_12_ = SUB1512(auVar26 << 0x20,3);
          auVar32[2] = uVar33;
          auVar32[1] = 0;
          auVar32[0xf] = 0;
          auVar32 = pshuflw(auVar32,auVar32,0x1b);
          sVar1 = auVar32._0_2_;
          sVar2 = auVar32._2_2_;
          sVar3 = auVar32._4_2_;
          sVar4 = auVar32._6_2_;
          local_38 = (double)CONCAT44(local_38._4_4_,
                                      CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar32[6] -
                                               (0xff < sVar4),
                                               CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar32[4] -
                                                        (0xff < sVar3),
                                                        CONCAT11((0 < sVar2) * (sVar2 < 0x100) *
                                                                 auVar32[2] - (0xff < sVar2),
                                                                 (0 < sVar1) * (sVar1 < 0x100) *
                                                                 auVar32[0] - (0xff < sVar1)))));
          break;
        case 8:
          auVar10._8_6_ = 0;
          auVar10._0_8_ = local_38;
          auVar10[0xe] = uVar39;
          auVar12._8_4_ = 0;
          auVar12._0_8_ = local_38;
          auVar12[0xc] = uVar38;
          auVar12._13_2_ = auVar10._13_2_;
          auVar14._8_4_ = 0;
          auVar14._0_8_ = local_38;
          auVar14._12_3_ = auVar12._12_3_;
          auVar16._8_2_ = 0;
          auVar16._0_8_ = local_38;
          auVar16[10] = uVar37;
          auVar16._11_4_ = auVar14._11_4_;
          auVar18._8_2_ = 0;
          auVar18._0_8_ = local_38;
          auVar18._10_5_ = auVar16._10_5_;
          auVar20[8] = uVar36;
          auVar20._0_8_ = local_38;
          auVar20._9_6_ = auVar18._9_6_;
          auVar31[7] = 0;
          auVar31._0_7_ = auVar20._8_7_;
          auVar23._7_8_ = 0;
          auVar23._0_7_ = auVar20._8_7_;
          auVar27._1_8_ = SUB158(auVar23 << 0x40,7);
          auVar27[0] = uVar35;
          auVar27._9_6_ = 0;
          auVar24._1_10_ = SUB1510(auVar27 << 0x30,5);
          auVar24[0] = uVar34;
          auVar28._11_4_ = 0;
          auVar28._0_11_ = auVar24;
          auVar21._3_12_ = SUB1512(auVar28 << 0x20,3);
          auVar21[2] = uVar33;
          auVar21[1] = 0;
          auVar21[0] = auVar32[0];
          auVar31._8_4_ = auVar21._0_4_;
          auVar31._12_4_ = auVar24._0_4_;
          auVar32 = pshuflw(auVar31,auVar31,0x1b);
          auVar32 = pshufhw(auVar32,auVar32,0x1b);
          sVar1 = auVar32._0_2_;
          sVar2 = auVar32._2_2_;
          sVar3 = auVar32._4_2_;
          sVar4 = auVar32._6_2_;
          sVar5 = auVar32._8_2_;
          sVar6 = auVar32._10_2_;
          sVar7 = auVar32._12_2_;
          sVar8 = auVar32._14_2_;
          local_38 = (double)CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar32[0xe] - (0xff < sVar8),
                                      CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar32[0xc] -
                                               (0xff < sVar7),
                                               CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar32[10]
                                                        - (0xff < sVar6),
                                                        CONCAT14((0 < sVar5) * (sVar5 < 0x100) *
                                                                 auVar32[8] - (0xff < sVar5),
                                                                 CONCAT13((0 < sVar4) *
                                                                          (sVar4 < 0x100) *
                                                                          auVar32[6] -
                                                                          (0xff < sVar4),
                                                                          CONCAT12((0 < sVar3) *
                                                                                   (sVar3 < 0x100) *
                                                                                   auVar32[4] -
                                                                                   (0xff < sVar3),
                                                                                   CONCAT11((0 < 
                                                  sVar2) * (sVar2 < 0x100) * auVar32[2] -
                                                  (0xff < sVar2),
                                                  (0 < sVar1) * (sVar1 < 0x100) * auVar32[0] -
                                                  (0xff < sVar1))))))));
        }
      }
      value = local_38._0_1_;
      value_00 = local_38._0_2_;
      switch(definition->read_type) {
      case coda_native_type_int8:
        pcVar30 = coda_mem_int8_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                    (coda_product *)product_file,value);
        break;
      case coda_native_type_uint8:
        pcVar30 = coda_mem_uint8_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                     (coda_product *)product_file,value);
        break;
      case coda_native_type_int16:
        pcVar30 = coda_mem_int16_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                     (coda_product *)product_file,value_00);
        break;
      case coda_native_type_uint16:
        pcVar30 = coda_mem_uint16_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                      (coda_product *)product_file,value_00);
        break;
      case coda_native_type_int32:
        pcVar30 = coda_mem_int32_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                     (coda_product *)product_file,(int32_t)local_38._0_4_);
        break;
      case coda_native_type_uint32:
        pcVar30 = coda_mem_uint32_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                      (coda_product *)product_file,(uint32_t)local_38._0_4_);
        break;
      case coda_native_type_int64:
        pcVar30 = coda_mem_int64_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                     (coda_product *)product_file,(int64_t)local_38);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                      ,0xaf,
                      "int read_attribute_sub(coda_cdf_product *, int64_t, int32_t, coda_type *, coda_dynamic_type **)"
                     );
      case coda_native_type_float:
        pcVar30 = coda_mem_float_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                     (coda_product *)product_file,local_38._0_4_);
        break;
      case coda_native_type_double:
        pcVar30 = coda_mem_double_new((coda_type_number *)definition,(coda_dynamic_type *)0x0,
                                      (coda_product *)product_file,local_38);
      }
      *attribute = (coda_dynamic_type *)pcVar30;
      goto LAB_00143417;
    }
  }
  return -1;
}

Assistant:

static int read_attribute_sub(coda_cdf_product *product_file, int64_t offset, int32_t byte_size, coda_type *definition,
                              coda_dynamic_type **attribute)
{
    if (definition->type_class == coda_text_class)
    {
        char *buffer;

        buffer = malloc(byte_size + 1);
        if (buffer == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)byte_size + 1, __FILE__, __LINE__);
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset, byte_size, buffer) != 0)
        {
            free(buffer);
            return -1;
        }
        buffer[byte_size] = '\0';
        *attribute = (coda_dynamic_type *)coda_mem_string_new((coda_type_text *)definition, NULL,
                                                              (coda_product *)product_file, buffer);
        free(buffer);
    }
    else
    {
#ifdef WORDS_BIGENDIAN
        coda_endianness other_endianness = coda_little_endian;
#else
        coda_endianness other_endianness = coda_big_endian;
#endif
        union
        {
            int8_t as_int8[8];
            uint8_t as_uint8[8];
            int16_t as_int16[4];
            uint16_t as_uint16[4];
            int32_t as_int32[2];
            uint32_t as_uint32[2];
            int64_t as_int64[1];
            float as_float[2];
            double as_double[1];
        } buffer;

        if (read_bytes(product_file->raw_product, offset, byte_size, buffer.as_int8) != 0)
        {
            return -1;
        }
        if (product_file->endianness == other_endianness)
        {
            switch (byte_size)
            {
                case 1:
                    break;
                case 2:
                    swap2(buffer.as_int16);
                    break;
                case 4:
                    swap4(buffer.as_int32);
                    break;
                case 8:
                    swap8(buffer.as_int64);
                    break;
                default:
                    assert(0);
                    exit(1);
            }
        }
        switch (definition->read_type)
        {
            case coda_native_type_int8:
                *attribute = (coda_dynamic_type *)coda_mem_int8_new((coda_type_number *)definition, NULL,
                                                                    (coda_product *)product_file, buffer.as_int8[0]);
                break;
            case coda_native_type_uint8:
                *attribute = (coda_dynamic_type *)coda_mem_uint8_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_uint8[0]);
                break;
            case coda_native_type_int16:
                *attribute = (coda_dynamic_type *)coda_mem_int16_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_int16[0]);
                break;
            case coda_native_type_uint16:
                *attribute = (coda_dynamic_type *)coda_mem_uint16_new((coda_type_number *)definition, NULL,
                                                                      (coda_product *)product_file,
                                                                      buffer.as_uint16[0]);
                break;
            case coda_native_type_int32:
                *attribute = (coda_dynamic_type *)coda_mem_int32_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_int32[0]);
                break;
            case coda_native_type_uint32:
                *attribute = (coda_dynamic_type *)coda_mem_uint32_new((coda_type_number *)definition, NULL,
                                                                      (coda_product *)product_file,
                                                                      buffer.as_uint32[0]);
                break;
            case coda_native_type_int64:
                *attribute = (coda_dynamic_type *)coda_mem_int64_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_int64[0]);
                break;
            case coda_native_type_float:
                *attribute = (coda_dynamic_type *)coda_mem_float_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_float[0]);
                break;
            case coda_native_type_double:
                *attribute = (coda_dynamic_type *)coda_mem_double_new((coda_type_number *)definition, NULL,
                                                                      (coda_product *)product_file,
                                                                      buffer.as_double[0]);
                break;
            default:
                assert(0);
                exit(1);
        }
    }
    if (*attribute == NULL)
    {
        return -1;
    }
    return 0;
}